

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffInfo.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ApprovalTests::DiffInfo::getProgramFileLocations_abi_cxx11_(void)

{
  char *extraout_RDX;
  char *name;
  char *extraout_RDX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  pointer ppcVar1;
  initializer_list<const_char_*> __l;
  allocator_type local_61;
  vector<const_char_*,_std::allocator<const_char_*>_> envVars;
  string envVarValue;
  
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  envVarValue.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_219674;
  envVarValue._M_dataplus._M_p = "ProgramFiles";
  envVarValue._M_string_length = (size_type)anon_var_dwarf_21966a;
  __l._M_len = 3;
  __l._M_array = (iterator)&envVarValue;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&envVars,__l,&local_61);
  name = extraout_RDX;
  for (ppcVar1 = envVars.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar1 !=
      envVars.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    SystemUtils::safeGetEnv_abi_cxx11_(&envVarValue,(SystemUtils *)*ppcVar1,name);
    if (envVarValue._M_string_length != 0) {
      ::std::__cxx11::string::push_back((char)&envVarValue);
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_RDI,(value_type *)&envVarValue);
    }
    ::std::__cxx11::string::~string((string *)&envVarValue);
    name = extraout_RDX_00;
  }
  ::std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&envVars.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> DiffInfo::getProgramFileLocations()
    {
        std::vector<std::string> possibleWindowsPaths;
        const std::vector<const char*> envVars = {
            "ProgramFiles", "ProgramW6432", "ProgramFiles(x86)"};

        for (const auto& envVar : envVars)
        {
            std::string envVarValue = SystemUtils::safeGetEnv(envVar);
            if (!envVarValue.empty())
            {
                envVarValue += '\\';
                possibleWindowsPaths.push_back(envVarValue);
            }
        }
        return possibleWindowsPaths;
    }